

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sokol_imgui.h
# Opt level: O3

void simgui_setup(simgui_desc_t_conflict *desc)

{
  undefined4 uVar1;
  undefined4 uVar2;
  wchar_t wVar3;
  sg_shader sVar4;
  ImGuiStyle *dst;
  ImGuiIO *pIVar5;
  wchar_t bytes_per_pixel;
  wchar_t font_height;
  wchar_t font_width;
  sg_buffer_desc ib_desc;
  sg_buffer_desc vb_desc;
  sg_pipeline_desc pip_desc;
  int local_ee4;
  int local_ee0;
  int local_edc;
  sg_buffer_desc local_ed8;
  sg_buffer_desc local_e78;
  sg_pipeline_desc local_e10;
  undefined1 local_bd8 [1616];
  char *local_588;
  char *local_548;
  char *local_100;
  undefined8 local_f8;
  char *local_40;
  
  if (desc == (simgui_desc_t_conflict *)0x0) {
    __assert_fail("desc",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/sokol/sokol_imgui.h"
                  ,0x655,"void simgui_setup(const simgui_desc_t *)");
  }
  memset(&_simgui.vbuf,0,0x440);
  uVar1 = desc->max_vertices;
  uVar2 = desc->color_format;
  _simgui.desc.depth_format = desc->depth_format;
  _simgui.desc.sample_count = desc->sample_count;
  _simgui.desc.ini_filename = desc->ini_filename;
  _simgui.desc.no_default_font = desc->no_default_font;
  _simgui.desc.disable_hotkeys = desc->disable_hotkeys;
  _simgui.desc._34_6_ = *(undefined6 *)&desc->field_0x22;
  wVar3 = L'𐀀';
  if (uVar1 != L'\0') {
    wVar3 = uVar1;
  }
  _simgui.desc.color_format = uVar2;
  _simgui.desc.max_vertices = wVar3;
  _simgui.desc.dpi_scale = (float)*(undefined8 *)&desc->dpi_scale;
  _simgui.desc._20_4_ = SUB84((ulong)*(undefined8 *)&desc->dpi_scale >> 0x20,0);
  _simgui.desc.dpi_scale =
       (float)(~-(uint)(_simgui.desc.dpi_scale == 0.0) & (uint)_simgui.desc.dpi_scale |
              -(uint)(_simgui.desc.dpi_scale == 0.0) & 0x3f800000);
  if (wVar3 < L'\x01') {
    __assert_fail("_simgui.desc.max_vertices > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/sokol/sokol_imgui.h"
                  ,0x662,"void simgui_setup(const simgui_desc_t *)");
  }
  _simgui.vertices.size = (ulong)(uint)wVar3 * 0x14;
  _simgui.vertices.ptr = malloc(_simgui.vertices.size);
  if (_simgui.vertices.ptr == (void *)0x0) {
    __assert_fail("_simgui.vertices.ptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/sokol/sokol_imgui.h"
                  ,0x665,"void simgui_setup(const simgui_desc_t *)");
  }
  _simgui.indices.size = (ulong)(uint)wVar3 * 6;
  _simgui.indices.ptr = malloc(_simgui.indices.size);
  if (_simgui.indices.ptr != (void *)0x0) {
    igCreateContext((ImFontAtlas *)0x0);
    dst = igGetStyle();
    igStyleColorsDark(dst);
    pIVar5 = igGetIO();
    if (_simgui.desc.no_default_font == false) {
      ImFontAtlas_AddFontDefault(pIVar5->Fonts,(ImFontConfig *)0x0);
    }
    pIVar5->IniFilename = _simgui.desc.ini_filename;
    pIVar5->ConfigMacOSXBehaviors = false;
    *(byte *)&pIVar5->BackendFlags = (byte)pIVar5->BackendFlags | 8;
    pIVar5->KeyMap[0] = 0x102;
    pIVar5->KeyMap[1] = 0x107;
    pIVar5->KeyMap[2] = 0x106;
    pIVar5->KeyMap[3] = 0x109;
    pIVar5->KeyMap[4] = 0x108;
    pIVar5->KeyMap[5] = 0x10a;
    pIVar5->KeyMap[6] = 0x10b;
    pIVar5->KeyMap[7] = 0x10c;
    pIVar5->KeyMap[8] = 0x10d;
    pIVar5->KeyMap[10] = 0x105;
    pIVar5->KeyMap[0xb] = 0x103;
    pIVar5->KeyMap[0xc] = 0x20;
    pIVar5->KeyMap[0xd] = 0x101;
    pIVar5->KeyMap[0xe] = 0x100;
    if (_simgui.desc.disable_hotkeys == false) {
      pIVar5->KeyMap[0x10] = 0x41;
      pIVar5->KeyMap[0x11] = 0x43;
      pIVar5->KeyMap[0x12] = 0x56;
      pIVar5->KeyMap[0x13] = 0x58;
      pIVar5->KeyMap[0x14] = 0x59;
      pIVar5->KeyMap[0x15] = 0x5a;
    }
    pIVar5->SetClipboardTextFn = _simgui_set_clipboard;
    pIVar5->GetClipboardTextFn = _simgui_get_clipboard;
    if (_sg.valid == false) {
      __assert_fail("_sg.valid",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/sokol/sokol_gfx.h"
                    ,0x3c9b,"void sg_push_debug_group(const char *)");
    }
    local_e78.data.ptr = (void *)0x0;
    local_e78._start_canary = 0;
    local_e78._4_4_ = 0;
    local_e78.data.size = 0;
    local_e78.wgpu_buffer = (void *)0x0;
    local_e78._end_canary = 0;
    local_e78._92_4_ = 0;
    local_e78.mtl_buffers[1] = (void *)0x0;
    local_e78.d3d11_buffer = (void *)0x0;
    local_e78.gl_buffers[0] = 0;
    local_e78.gl_buffers[1] = 0;
    local_e78.mtl_buffers[0] = (void *)0x0;
    local_e78.type = _SG_BUFFERTYPE_DEFAULT;
    local_e78.usage = SG_USAGE_STREAM;
    local_e78.size = _simgui.vertices.size;
    local_e78.label = "sokol-imgui-vertices";
    _simgui.vbuf = sg_make_buffer(&local_e78);
    local_ed8.data.ptr = (void *)0x0;
    local_ed8._start_canary = 0;
    local_ed8._4_4_ = 0;
    local_ed8.data.size = 0;
    local_ed8.wgpu_buffer = (void *)0x0;
    local_ed8._end_canary = 0;
    local_ed8._92_4_ = 0;
    local_ed8.mtl_buffers[1] = (void *)0x0;
    local_ed8.d3d11_buffer = (void *)0x0;
    local_ed8.gl_buffers[0] = 0;
    local_ed8.gl_buffers[1] = 0;
    local_ed8.mtl_buffers[0] = (void *)0x0;
    local_ed8.type = SG_BUFFERTYPE_INDEXBUFFER;
    local_ed8.usage = SG_USAGE_STREAM;
    local_ed8.size = _simgui.indices.size;
    local_ed8.label = "sokol-imgui-indices";
    _simgui.ibuf = sg_make_buffer(&local_ed8);
    if (_simgui.desc.no_default_font == false) {
      ImFontAtlas_GetTexDataAsRGBA32
                (pIVar5->Fonts,(uchar **)&local_e10,&local_edc,&local_ee0,&local_ee4);
      memset((sg_image_desc *)local_bd8,0,0x698);
      local_bd8._12_4_ = local_edc;
      local_bd8._16_4_ = local_ee0;
      local_bd8._32_4_ = SG_PIXELFORMAT_RGBA8;
      local_bd8._40_8_ = (char *)0x200000002;
      local_bd8._48_8_ = 0x200000002;
      local_bd8._88_8_ = (long)(local_ee0 * local_edc) << 2;
      local_588 = "sokol-imgui-font";
      _simgui.img = sg_make_image((sg_image_desc *)local_bd8);
      pIVar5->Fonts->TexID = (ImTextureID)(ulong)_simgui.img.id;
    }
    memset((sg_shader_desc *)local_bd8,0,0xba8);
    local_bd8._8_8_ = "position";
    local_bd8._32_8_ = "texcoord0";
    local_bd8._56_8_ = "color0";
    local_bd8._16_8_ = "TEXCOORD";
    local_bd8._40_8_ = "TEXCOORD";
    local_bd8._48_4_ = SG_WRAP_REPEAT;
    local_bd8._64_8_ = "TEXCOORD";
    local_bd8._72_4_ = 2.8026e-45;
    local_bd8._432_8_ = (void *)0x10;
    local_bd8._440_8_ = "vs_params";
    local_bd8._448_8_ = (void *)0x100000004;
    local_100 = "tex";
    local_f8._0_4_ = SG_IMAGETYPE_2D;
    local_f8._4_4_ = SG_SAMPLERTYPE_FLOAT;
    local_40 = "sokol-imgui-shader";
    local_bd8._392_8_ =
         "#version 330\n\nuniform vec4 vs_params[1];\nlayout(location = 0) in vec2 position;\nout vec2 uv;\nlayout(location = 1) in vec2 texcoord0;\nout vec4 color;\nlayout(location = 2) in vec4 color0;\n\nvoid main()\n{\n    gl_Position = vec4(((position / vs_params[0].xy) - vec2(0.5)) * vec2(2.0, -2.0), 0.5, 1.0);\n    uv = texcoord0;\n    color = color0;\n}\n\n"
    ;
    local_548 = 
    "#version 330\n\nuniform sampler2D tex;\n\nlayout(location = 0) out vec4 frag_color;\nin vec2 uv;\nin vec4 color;\n\nvoid main()\n{\n    frag_color = texture(tex, uv) * color;\n}\n\n"
    ;
    sVar4 = sg_make_shader((sg_shader_desc *)local_bd8);
    _simgui.shd = sVar4;
    memset(&local_e10,0,0x238);
    local_e10.layout.buffers[0].stride = 0x14;
    local_e10.layout.attrs[0].format = SG_VERTEXFORMAT_FLOAT2;
    local_e10.layout.attrs[1].offset = 8;
    local_e10.layout.attrs[1].format = SG_VERTEXFORMAT_FLOAT2;
    local_e10.layout.attrs[2].offset = 0x10;
    local_e10.layout.attrs[2].format = SG_VERTEXFORMAT_UBYTE4N;
    local_e10.index_type = SG_INDEXTYPE_UINT16;
    local_e10.sample_count = _simgui.desc.sample_count;
    local_e10.depth.pixel_format = _simgui.desc.depth_format;
    local_e10.colors[0].pixel_format = _simgui.desc.color_format;
    local_e10.colors[0].write_mask = SG_COLORMASK_RGB;
    local_e10.colors[0].blend.enabled = true;
    local_e10.colors[0].blend.src_factor_rgb = SG_BLENDFACTOR_SRC_ALPHA;
    local_e10.colors[0].blend.dst_factor_rgb = SG_BLENDFACTOR_ONE_MINUS_SRC_ALPHA;
    local_e10.label = "sokol-imgui-pipeline";
    local_e10.shader = sVar4;
    _simgui.pip = sg_make_pipeline(&local_e10);
    if (_sg.valid != false) {
      return;
    }
    __assert_fail("_sg.valid",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/sokol/sokol_gfx.h"
                  ,0x3ca2,"void sg_pop_debug_group(void)");
  }
  __assert_fail("_simgui.indices.ptr",
                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/sokol/sokol_imgui.h"
                ,0x668,"void simgui_setup(const simgui_desc_t *)");
}

Assistant:

SOKOL_API_IMPL void simgui_setup(const simgui_desc_t* desc) {
    SOKOL_ASSERT(desc);
    memset(&_simgui, 0, sizeof(_simgui));
    _simgui.desc = *desc;
    _simgui.desc.max_vertices = _simgui_def(_simgui.desc.max_vertices, 65536);
    _simgui.desc.dpi_scale = _simgui_def(_simgui.desc.dpi_scale, 1.0f);
    #if !defined(SOKOL_IMGUI_NO_SOKOL_APP)
    _simgui.is_osx = _simgui_is_osx();
    #endif
    /* can keep color_format, depth_format and sample_count as is,
       since sokol_gfx.h will do its own default-value handling
    */

    /* allocate an intermediate vertex- and index-buffer */
    SOKOL_ASSERT(_simgui.desc.max_vertices > 0);
    _simgui.vertices.size = (size_t)_simgui.desc.max_vertices * sizeof(ImDrawVert);
    _simgui.vertices.ptr = SOKOL_MALLOC(_simgui.vertices.size);
    SOKOL_ASSERT(_simgui.vertices.ptr);
    _simgui.indices.size = (size_t)_simgui.desc.max_vertices * 3 * sizeof(ImDrawIdx);
    _simgui.indices.ptr = SOKOL_MALLOC(_simgui.indices.size);
    SOKOL_ASSERT(_simgui.indices.ptr);

    /* initialize Dear ImGui */
    #if defined(__cplusplus)
        ImGui::CreateContext();
        ImGui::StyleColorsDark();
        ImGuiIO* io = &ImGui::GetIO();
        if (!_simgui.desc.no_default_font) {
            io->Fonts->AddFontDefault();
        }
    #else
        igCreateContext(NULL);
        igStyleColorsDark(igGetStyle());
        ImGuiIO* io = igGetIO();
        if (!_simgui.desc.no_default_font) {
            ImFontAtlas_AddFontDefault(io->Fonts, NULL);
        }
    #endif
    io->IniFilename = _simgui.desc.ini_filename;
    io->ConfigMacOSXBehaviors = _simgui_is_osx();
    io->BackendFlags |= ImGuiBackendFlags_RendererHasVtxOffset;
    #if !defined(SOKOL_IMGUI_NO_SOKOL_APP)
        io->KeyMap[ImGuiKey_Tab] = SAPP_KEYCODE_TAB;
        io->KeyMap[ImGuiKey_LeftArrow] = SAPP_KEYCODE_LEFT;
        io->KeyMap[ImGuiKey_RightArrow] = SAPP_KEYCODE_RIGHT;
        io->KeyMap[ImGuiKey_UpArrow] = SAPP_KEYCODE_UP;
        io->KeyMap[ImGuiKey_DownArrow] = SAPP_KEYCODE_DOWN;
        io->KeyMap[ImGuiKey_PageUp] = SAPP_KEYCODE_PAGE_UP;
        io->KeyMap[ImGuiKey_PageDown] = SAPP_KEYCODE_PAGE_DOWN;
        io->KeyMap[ImGuiKey_Home] = SAPP_KEYCODE_HOME;
        io->KeyMap[ImGuiKey_End] = SAPP_KEYCODE_END;
        io->KeyMap[ImGuiKey_Delete] = SAPP_KEYCODE_DELETE;
        io->KeyMap[ImGuiKey_Backspace] = SAPP_KEYCODE_BACKSPACE;
        io->KeyMap[ImGuiKey_Space] = SAPP_KEYCODE_SPACE;
        io->KeyMap[ImGuiKey_Enter] = SAPP_KEYCODE_ENTER;
        io->KeyMap[ImGuiKey_Escape] = SAPP_KEYCODE_ESCAPE;
        if (!_simgui.desc.disable_hotkeys) {
            io->KeyMap[ImGuiKey_A] = SAPP_KEYCODE_A;
            io->KeyMap[ImGuiKey_C] = SAPP_KEYCODE_C;
            io->KeyMap[ImGuiKey_V] = SAPP_KEYCODE_V;
            io->KeyMap[ImGuiKey_X] = SAPP_KEYCODE_X;
            io->KeyMap[ImGuiKey_Y] = SAPP_KEYCODE_Y;
            io->KeyMap[ImGuiKey_Z] = SAPP_KEYCODE_Z;
        }
        #if !defined(SOKOL_IMGUI_NO_SOKOL_APP)
        io->SetClipboardTextFn = _simgui_set_clipboard;
        io->GetClipboardTextFn = _simgui_get_clipboard;
        #endif
    #endif

    /* create sokol-gfx resources */
    sg_push_debug_group("sokol-imgui");

    /* NOTE: since we're in C++ mode here we can't use C99 designated init */
    sg_buffer_desc vb_desc;
    memset(&vb_desc, 0, sizeof(vb_desc));
    vb_desc.usage = SG_USAGE_STREAM;
    vb_desc.size = _simgui.vertices.size;
    vb_desc.label = "sokol-imgui-vertices";
    _simgui.vbuf = sg_make_buffer(&vb_desc);

    sg_buffer_desc ib_desc;
    memset(&ib_desc, 0, sizeof(ib_desc));
    ib_desc.type = SG_BUFFERTYPE_INDEXBUFFER;
    ib_desc.usage = SG_USAGE_STREAM;
    ib_desc.size = _simgui.indices.size;
    ib_desc.label = "sokol-imgui-indices";
    _simgui.ibuf = sg_make_buffer(&ib_desc);

    /* default font texture */
    if (!_simgui.desc.no_default_font) {
        unsigned char* font_pixels;
        int font_width, font_height;
        #if defined(__cplusplus)
            io->Fonts->GetTexDataAsRGBA32(&font_pixels, &font_width, &font_height);
        #else
            int bytes_per_pixel;
            ImFontAtlas_GetTexDataAsRGBA32(io->Fonts, &font_pixels, &font_width, &font_height, &bytes_per_pixel);
        #endif
        sg_image_desc img_desc;
        memset(&img_desc, 0, sizeof(img_desc));
        img_desc.width = font_width;
        img_desc.height = font_height;
        img_desc.pixel_format = SG_PIXELFORMAT_RGBA8;
        img_desc.wrap_u = SG_WRAP_CLAMP_TO_EDGE;
        img_desc.wrap_v = SG_WRAP_CLAMP_TO_EDGE;
        img_desc.min_filter = SG_FILTER_LINEAR;
        img_desc.mag_filter = SG_FILTER_LINEAR;
        img_desc.data.subimage[0][0].ptr = font_pixels;
        img_desc.data.subimage[0][0].size = (size_t)(font_width * font_height) * sizeof(uint32_t);
        img_desc.label = "sokol-imgui-font";
        _simgui.img = sg_make_image(&img_desc);
        io->Fonts->TexID = (ImTextureID)(uintptr_t) _simgui.img.id;
    }

    /* shader object for using the embedded shader source (or bytecode) */
    sg_shader_desc shd_desc;
    memset(&shd_desc, 0, sizeof(shd_desc));
    shd_desc.attrs[0].name = "position";
    shd_desc.attrs[1].name = "texcoord0";
    shd_desc.attrs[2].name = "color0";
    shd_desc.attrs[0].sem_name = "TEXCOORD";
    shd_desc.attrs[0].sem_index = 0;
    shd_desc.attrs[1].sem_name = "TEXCOORD";
    shd_desc.attrs[1].sem_index = 1;
    shd_desc.attrs[2].sem_name = "TEXCOORD";
    shd_desc.attrs[2].sem_index = 2;
    sg_shader_uniform_block_desc* ub = &shd_desc.vs.uniform_blocks[0];
    ub->size = sizeof(_simgui_vs_params_t);
    ub->uniforms[0].name = "vs_params";
    ub->uniforms[0].type = SG_UNIFORMTYPE_FLOAT4;
    ub->uniforms[0].array_count = 1;
    shd_desc.fs.images[0].name = "tex";
    shd_desc.fs.images[0].image_type = SG_IMAGETYPE_2D;
    shd_desc.fs.images[0].sampler_type = SG_SAMPLERTYPE_FLOAT;
    shd_desc.label = "sokol-imgui-shader";
    #if defined(SOKOL_GLCORE33)
        shd_desc.vs.source = _simgui_vs_source_glsl330;
        shd_desc.fs.source = _simgui_fs_source_glsl330;
    #elif defined(SOKOL_GLES2) || defined(SOKOL_GLES3)
        shd_desc.vs.source = _simgui_vs_source_glsl100;
        shd_desc.fs.source = _simgui_fs_source_glsl100;
    #elif defined(SOKOL_METAL)
        shd_desc.vs.entry = "main0";
        shd_desc.fs.entry = "main0";
        switch (sg_query_backend()) {
            case SG_BACKEND_METAL_MACOS:
                shd_desc.vs.bytecode = SG_RANGE(_simgui_vs_bytecode_metal_macos);
                shd_desc.fs.bytecode = SG_RANGE(_simgui_fs_bytecode_metal_macos);
                break;
            case SG_BACKEND_METAL_IOS:
                shd_desc.vs.bytecode = SG_RANGE(_simgui_vs_bytecode_metal_ios);
                shd_desc.fs.bytecode = SG_RANGE(_simgui_fs_bytecode_metal_ios);
                break;
            default:
                shd_desc.vs.source = _simgui_vs_source_metal_sim;
                shd_desc.fs.source = _simgui_fs_source_metal_sim;
                break;
        }
    #elif defined(SOKOL_D3D11)
        shd_desc.vs.bytecode = SG_RANGE(_simgui_vs_bytecode_hlsl4);
        shd_desc.fs.bytecode = SG_RANGE(_simgui_fs_bytecode_hlsl4);
    #elif defined(SOKOL_WGPU)
        shd_desc.vs.bytecode = SG_RANGE(_simgui_vs_bytecode_wgpu);
        shd_desc.fs.bytecode = SG_RANGE(_simgui_fs_bytecode_wgpu);
    #else
        shd_desc.vs.source = _simgui_vs_source_dummy;
        shd_desc.fs.source = _simgui_fs_source_dummy;
    #endif
    _simgui.shd = sg_make_shader(&shd_desc);

    /* pipeline object for imgui rendering */
    sg_pipeline_desc pip_desc;
    memset(&pip_desc, 0, sizeof(pip_desc));
    pip_desc.layout.buffers[0].stride = sizeof(ImDrawVert);
    {
        sg_vertex_attr_desc* attr = &pip_desc.layout.attrs[0];
        attr->offset = offsetof(ImDrawVert, pos);
        attr->format = SG_VERTEXFORMAT_FLOAT2;
    }
    {
        sg_vertex_attr_desc* attr = &pip_desc.layout.attrs[1];
        attr->offset = offsetof(ImDrawVert, uv);
        attr->format = SG_VERTEXFORMAT_FLOAT2;
    }
    {
        sg_vertex_attr_desc* attr = &pip_desc.layout.attrs[2];
        attr->offset = offsetof(ImDrawVert, col);
        attr->format = SG_VERTEXFORMAT_UBYTE4N;
    }
    pip_desc.shader = _simgui.shd;
    pip_desc.index_type = SG_INDEXTYPE_UINT16;
    pip_desc.sample_count = _simgui.desc.sample_count;
    pip_desc.depth.pixel_format = _simgui.desc.depth_format;
    pip_desc.colors[0].pixel_format = _simgui.desc.color_format;
    pip_desc.colors[0].write_mask = SG_COLORMASK_RGB;
    pip_desc.colors[0].blend.enabled = true;
    pip_desc.colors[0].blend.src_factor_rgb = SG_BLENDFACTOR_SRC_ALPHA;
    pip_desc.colors[0].blend.dst_factor_rgb = SG_BLENDFACTOR_ONE_MINUS_SRC_ALPHA;
    pip_desc.label = "sokol-imgui-pipeline";
    _simgui.pip = sg_make_pipeline(&pip_desc);

    sg_pop_debug_group();
}